

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O3

void __thiscall
btMultiBody::setupFixed
          (btMultiBody *this,int i,btScalar mass,btVector3 *inertia,int parent,
          btQuaternion *rotParentToThis,btVector3 *parentComToThisPivotOffset,
          btVector3 *thisPivotToThisComOffset,bool param_8)

{
  btVector3 *pbVar1;
  btQuaternion *pbVar2;
  int *piVar3;
  undefined8 uVar4;
  btMultibodyLink *pbVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  
  pbVar5 = (this->m_links).m_data;
  pbVar5[i].m_mass = mass;
  uVar4 = *(undefined8 *)(inertia->m_floats + 2);
  pbVar1 = &pbVar5[i].m_inertiaLocal;
  *(undefined8 *)pbVar1->m_floats = *(undefined8 *)inertia->m_floats;
  *(undefined8 *)(pbVar1->m_floats + 2) = uVar4;
  pbVar5 = (this->m_links).m_data;
  pbVar5[i].m_parent = parent;
  uVar4 = *(undefined8 *)((rotParentToThis->super_btQuadWord).m_floats + 2);
  pbVar2 = &pbVar5[i].m_zeroRotParentToThis;
  *(undefined8 *)(pbVar2->super_btQuadWord).m_floats =
       *(undefined8 *)(rotParentToThis->super_btQuadWord).m_floats;
  *(undefined8 *)((pbVar2->super_btQuadWord).m_floats + 2) = uVar4;
  uVar4 = *(undefined8 *)(thisPivotToThisComOffset->m_floats + 2);
  pbVar1 = &(this->m_links).m_data[i].m_dVector;
  *(undefined8 *)pbVar1->m_floats = *(undefined8 *)thisPivotToThisComOffset->m_floats;
  *(undefined8 *)(pbVar1->m_floats + 2) = uVar4;
  uVar4 = *(undefined8 *)(parentComToThisPivotOffset->m_floats + 2);
  pbVar1 = &(this->m_links).m_data[i].m_eVector;
  *(undefined8 *)pbVar1->m_floats = *(undefined8 *)parentComToThisPivotOffset->m_floats;
  *(undefined8 *)(pbVar1->m_floats + 2) = uVar4;
  pbVar5 = (this->m_links).m_data;
  pbVar5[i].m_jointType = eFixed;
  pbVar5[i].m_dofCount = 0;
  pbVar5[i].m_posVarCount = 0;
  *(byte *)&pbVar5[i].m_flags = (byte)pbVar5[i].m_flags | 1;
  btMultibodyLink::updateCacheMultiDof(pbVar5 + i,(btScalar *)0x0);
  lVar6 = (long)(this->m_links).m_size;
  if (0 < lVar6) {
    pbVar5 = (this->m_links).m_data;
    iVar8 = 0;
    iVar9 = 0;
    lVar7 = 0;
    do {
      piVar3 = (int *)((long)(pbVar5->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                      lVar7 + -8);
      *piVar3 = iVar8;
      piVar3[1] = iVar9;
      uVar4 = *(undefined8 *)
               ((long)(pbVar5->m_cachedWorldTransform).m_basis.m_el[0].m_floats + lVar7 + -0x14);
      iVar8 = iVar8 + (int)uVar4;
      iVar9 = iVar9 + (int)((ulong)uVar4 >> 0x20);
      lVar7 = lVar7 + 600;
    } while (lVar6 * 600 - lVar7 != 0);
  }
  return;
}

Assistant:

void btMultiBody::setupFixed(int i,
						   btScalar mass,
						   const btVector3 &inertia,
						   int parent,
						   const btQuaternion &rotParentToThis,
						   const btVector3 &parentComToThisPivotOffset,
                           const btVector3 &thisPivotToThisComOffset, bool /*deprecatedDisableParentCollision*/)
{
	
	m_links[i].m_mass = mass;
    m_links[i].m_inertiaLocal = inertia;
    m_links[i].m_parent = parent;
    m_links[i].m_zeroRotParentToThis = rotParentToThis;
	m_links[i].m_dVector = thisPivotToThisComOffset;
    m_links[i].m_eVector = parentComToThisPivotOffset;    

	m_links[i].m_jointType = btMultibodyLink::eFixed;
	m_links[i].m_dofCount = 0;
	m_links[i].m_posVarCount = 0;

	m_links[i].m_flags |=BT_MULTIBODYLINKFLAGS_DISABLE_PARENT_COLLISION;    
	
	m_links[i].updateCacheMultiDof();

	updateLinksDofOffsets();

}